

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

void __thiscall
rtb::Filter::Polynomial<double>::Polynomial
          (Polynomial<double> *this,initializer_list<double> *coefficients)

{
  iterator pdVar1;
  size_type sVar2;
  size_t sVar3;
  long lVar4;
  complex<double> local_38;
  
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coefficients_).
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar1 = coefficients->_M_array;
  sVar2 = coefficients->_M_len;
  for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    local_38._M_value._0_8_ = *(undefined8 *)((long)pdVar1 + lVar4);
    local_38._M_value._8_8_ = 0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<std::complex<double>>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)this,&local_38);
  }
  removeHighOrderZeroCoefficients(this);
  sVar3 = (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->coefficients_).
                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
  this->size_ = sVar3;
  this->order_ = sVar3 - 1;
  return;
}

Assistant:

Polynomial<T>::Polynomial(const std::initializer_list<T>& coefficients) {

            for (auto c : coefficients)
                coefficients_.push_back(c);

            removeHighOrderZeroCoefficients();
            updateOrderAndSize();
        }